

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallExportGenerator::GenerateScriptConfigs
          (cmInstallExportGenerator *this,ostream *os,Indent indent)

{
  string *a;
  cmExportInstallFileGenerator *pcVar1;
  cmScriptGeneratorIndent indent_00;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  cmScriptGeneratorIndent indent_01;
  cmScriptGeneratorIndent indent_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string installedFile;
  string installedDir;
  string cxx_module_dest;
  string local_90;
  string config_file_example;
  string toInstallFile;
  
  cmScriptGenerator::GenerateScriptConfigs((cmScriptGenerator *)this,os,indent);
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar1 = (this->EFGen)._M_t.
           super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
           .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl;
  indent_00.Level = indent.Level + 2;
  a = &(this->super_cmInstallGenerator).Destination;
  for (p_Var3 = *(_Base_ptr *)((long)&(pcVar1->ConfigImportFiles)._M_t + 0x18);
      p_Var3 != (_Rb_tree_node_base *)((long)&(pcVar1->ConfigImportFiles)._M_t + 8U);
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&files,(value_type *)(p_Var3 + 2));
    cmScriptGenerator::CreateConfigTest
              (&cxx_module_dest,(cmScriptGenerator *)this,(string *)(p_Var3 + 1));
    poVar2 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar2 = std::operator<<(poVar2,"if(");
    poVar2 = std::operator<<(poVar2,(string *)&cxx_module_dest);
    std::operator<<(poVar2,")\n");
    cmInstallGenerator::AddInstallRule
              (&this->super_cmInstallGenerator,os,a,cmInstallType_FILES,&files,false,
               (this->FilePermissions)._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0,
               (Indent)indent_00.Level,(char *)0x0);
    poVar2 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    std::operator<<(poVar2,"endif()\n");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&files);
    std::__cxx11::string::~string((string *)&cxx_module_dest);
  }
  config_file_example._M_dataplus._M_p._0_1_ = 0x2f;
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
            (&cxx_module_dest,a,(char *)&config_file_example,&this->CxxModulesDirectory);
  config_file_example._M_dataplus._M_p = (pointer)&config_file_example.field_2;
  config_file_example._M_string_length = 0;
  config_file_example.field_2._M_local_buf[0] = '\0';
  pcVar1 = (this->EFGen)._M_t.
           super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
           .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl;
  if (*(_Base_ptr *)((long)&(pcVar1->ConfigCxxModuleFiles)._M_t + 0x18) !=
      (_Base_ptr)((long)&(pcVar1->ConfigCxxModuleFiles)._M_t + 8U)) {
    std::__cxx11::string::_M_assign((string *)&config_file_example);
    if (config_file_example._M_string_length != 0) {
      cmInstallGenerator::ConvertToAbsoluteDestination(&installedFile,&cxx_module_dest);
      toInstallFile._M_dataplus._M_p._0_1_ = 0x2f;
      cmStrCat<char_const(&)[14],std::__cxx11::string,char>
                (&installedDir,(char (*) [14])"$ENV{DESTDIR}",&installedFile,(char *)&toInstallFile)
      ;
      std::__cxx11::string::~string((string *)&installedFile);
      cmStrCat<std::__cxx11::string&,char_const(&)[14],std::__cxx11::string_const&,char_const(&)[7]>
                (&installedFile,&installedDir,(char (*) [14])0x719fd4,&this->ExportSet->Name,
                 (char (*) [7])0x6dc5f6);
      cmsys::SystemTools::GetFilenamePath(&local_90,&config_file_example);
      cmStrCat<std::__cxx11::string,char_const(&)[14],std::__cxx11::string_const&,char_const(&)[7]>
                (&toInstallFile,&local_90,(char (*) [14])0x719fd4,&this->ExportSet->Name,
                 (char (*) [7])0x6dc5f6);
      std::__cxx11::string::~string((string *)&local_90);
      poVar2 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
      poVar2 = std::operator<<(poVar2,"if(EXISTS \"");
      poVar2 = std::operator<<(poVar2,(string *)&installedFile);
      std::operator<<(poVar2,"\")\n");
      poVar2 = operator<<(os,indent_00);
      poVar2 = std::operator<<(poVar2,"file(DIFFERENT _cmake_export_file_changed FILES\n");
      poVar2 = operator<<(poVar2,indent_00);
      poVar2 = std::operator<<(poVar2,"     \"");
      poVar2 = std::operator<<(poVar2,(string *)&installedFile);
      poVar2 = std::operator<<(poVar2,"\"\n");
      poVar2 = operator<<(poVar2,indent_00);
      poVar2 = std::operator<<(poVar2,"     \"");
      poVar2 = std::operator<<(poVar2,(string *)&toInstallFile);
      std::operator<<(poVar2,"\")\n");
      poVar2 = operator<<(os,indent_00);
      std::operator<<(poVar2,"if(_cmake_export_file_changed)\n");
      indent_02.Level = indent.Level + 4;
      poVar2 = operator<<(os,indent_02);
      poVar2 = std::operator<<(poVar2,"file(GLOB _cmake_old_config_files \"");
      poVar2 = std::operator<<(poVar2,(string *)&installedDir);
      cmExportInstallFileGenerator::GetConfigImportFileGlob_abi_cxx11_
                (&local_90,
                 (this->EFGen)._M_t.
                 super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
                 .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl);
      poVar2 = std::operator<<(poVar2,(string *)&local_90);
      std::operator<<(poVar2,"\")\n");
      std::__cxx11::string::~string((string *)&local_90);
      poVar2 = operator<<(os,indent_02);
      std::operator<<(poVar2,"if(_cmake_old_config_files)\n");
      indent_01.Level = indent.Level + 6;
      poVar2 = operator<<(os,indent_01);
      std::operator<<(poVar2,
                      "string(REPLACE \";\" \", \" _cmake_old_config_files_text \"${_cmake_old_config_files}\")\n"
                     );
      poVar2 = operator<<(os,indent_01);
      poVar2 = std::operator<<(poVar2,"message(STATUS \"Old C++ module export file \\\"");
      poVar2 = std::operator<<(poVar2,(string *)&installedFile);
      std::operator<<(poVar2,
                      "\\\" will be replaced.  Removing files [${_cmake_old_config_files_text}].\")\n"
                     );
      poVar2 = operator<<(os,indent_01);
      std::operator<<(poVar2,"unset(_cmake_old_config_files_text)\n");
      poVar2 = operator<<(os,indent_01);
      std::operator<<(poVar2,"file(REMOVE ${_cmake_old_config_files})\n");
      poVar2 = operator<<(os,indent_02);
      std::operator<<(poVar2,"endif()\n");
      poVar2 = operator<<(os,indent_02);
      std::operator<<(poVar2,"unset(_cmake_old_config_files)\n");
      poVar2 = operator<<(os,indent_00);
      std::operator<<(poVar2,"endif()\n");
      poVar2 = operator<<(os,indent_00);
      std::operator<<(poVar2,"unset(_cmake_export_file_changed)\n");
      poVar2 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
      std::operator<<(poVar2,"endif()\n");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&files,&toInstallFile);
      cmInstallGenerator::AddInstallRule
                (&this->super_cmInstallGenerator,os,&cxx_module_dest,cmInstallType_FILES,&files,
                 false,(this->FilePermissions)._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0,
                 indent,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&files);
      std::__cxx11::string::~string((string *)&toInstallFile);
      std::__cxx11::string::~string((string *)&installedFile);
      std::__cxx11::string::~string((string *)&installedDir);
    }
  }
  pcVar1 = (this->EFGen)._M_t.
           super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
           .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl;
  for (p_Var4 = *(_Base_ptr *)((long)&(pcVar1->ConfigCxxModuleFiles)._M_t + 0x18);
      p_Var4 != (_Rb_tree_node_base *)((long)&(pcVar1->ConfigCxxModuleFiles)._M_t + 8U);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&files,(value_type *)(p_Var4 + 2));
    cmScriptGenerator::CreateConfigTest
              (&installedDir,(cmScriptGenerator *)this,(string *)(p_Var4 + 1));
    poVar2 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar2 = std::operator<<(poVar2,"if(");
    poVar2 = std::operator<<(poVar2,(string *)&installedDir);
    std::operator<<(poVar2,")\n");
    cmInstallGenerator::AddInstallRule
              (&this->super_cmInstallGenerator,os,&cxx_module_dest,cmInstallType_FILES,&files,false,
               (this->FilePermissions)._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0,
               (Indent)indent_00.Level,(char *)0x0);
    poVar2 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    std::operator<<(poVar2,"endif()\n");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&files);
    std::__cxx11::string::~string((string *)&installedDir);
  }
  pcVar1 = (this->EFGen)._M_t.
           super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
           .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl;
  for (p_Var4 = *(_Base_ptr *)((long)&(pcVar1->ConfigCxxModuleTargetFiles)._M_t + 0x18);
      p_Var4 != (_Rb_tree_node_base *)((long)&(pcVar1->ConfigCxxModuleTargetFiles)._M_t + 8U);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    cmScriptGenerator::CreateConfigTest
              (&installedDir,(cmScriptGenerator *)this,(string *)(p_Var4 + 1));
    poVar2 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar2 = std::operator<<(poVar2,"if(");
    poVar2 = std::operator<<(poVar2,(string *)&installedDir);
    std::operator<<(poVar2,")\n");
    cmInstallGenerator::AddInstallRule
              (&this->super_cmInstallGenerator,os,&cxx_module_dest,cmInstallType_FILES,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(p_Var4 + 2),false,(this->FilePermissions)._M_dataplus._M_p,(char *)0x0,
               (char *)0x0,(char *)0x0,(Indent)indent_00.Level,(char *)0x0);
    poVar2 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    std::operator<<(poVar2,"endif()\n");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&files);
    std::__cxx11::string::~string((string *)&installedDir);
  }
  std::__cxx11::string::~string((string *)&config_file_example);
  std::__cxx11::string::~string((string *)&cxx_module_dest);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files);
  return;
}

Assistant:

void cmInstallExportGenerator::GenerateScriptConfigs(std::ostream& os,
                                                     Indent indent)
{
  // Create the main install rules first.
  this->cmInstallGenerator::GenerateScriptConfigs(os, indent);

  // Now create a configuration-specific install rule for the import
  // file of each configuration.
  std::vector<std::string> files;
  for (auto const& i : this->EFGen->GetConfigImportFiles()) {
    files.push_back(i.second);
    std::string config_test = this->CreateConfigTest(i.first);
    os << indent << "if(" << config_test << ")\n";
    this->AddInstallRule(os, this->Destination, cmInstallType_FILES, files,
                         false, this->FilePermissions.c_str(), nullptr,
                         nullptr, nullptr, indent.Next());
    os << indent << "endif()\n";
    files.clear();
  }

  // Now create a configuration-specific install rule for the C++ module import
  // property file of each configuration.
  auto cxx_module_dest =
    cmStrCat(this->Destination, '/', this->CxxModulesDirectory);
  std::string config_file_example;
  for (auto const& i : this->EFGen->GetConfigCxxModuleFiles()) {
    config_file_example = i.second;
    break;
  }
  if (!config_file_example.empty()) {
    // Remove old per-configuration export files if the main changes.
    std::string installedDir = cmStrCat(
      "$ENV{DESTDIR}", ConvertToAbsoluteDestination(cxx_module_dest), '/');
    std::string installedFile = cmStrCat(installedDir, "/cxx-modules-",
                                         this->ExportSet->GetName(), ".cmake");
    std::string toInstallFile =
      cmStrCat(cmSystemTools::GetFilenamePath(config_file_example),
               "/cxx-modules-", this->ExportSet->GetName(), ".cmake");
    os << indent << "if(EXISTS \"" << installedFile << "\")\n";
    Indent indentN = indent.Next();
    Indent indentNN = indentN.Next();
    Indent indentNNN = indentNN.Next();
    /* clang-format off */
    os << indentN << "file(DIFFERENT _cmake_export_file_changed FILES\n"
       << indentN << "     \"" << installedFile << "\"\n"
       << indentN << "     \"" << toInstallFile << "\")\n";
    os << indentN << "if(_cmake_export_file_changed)\n";
    os << indentNN << "file(GLOB _cmake_old_config_files \"" << installedDir
       << this->EFGen->GetConfigImportFileGlob() << "\")\n";
    os << indentNN << "if(_cmake_old_config_files)\n";
    os << indentNNN << "string(REPLACE \";\" \", \" _cmake_old_config_files_text \"${_cmake_old_config_files}\")\n";
    os << indentNNN << R"(message(STATUS "Old C++ module export file \")" << installedFile
       << "\\\" will be replaced.  Removing files [${_cmake_old_config_files_text}].\")\n";
    os << indentNNN << "unset(_cmake_old_config_files_text)\n";
    os << indentNNN << "file(REMOVE ${_cmake_old_config_files})\n";
    os << indentNN << "endif()\n";
    os << indentNN << "unset(_cmake_old_config_files)\n";
    os << indentN << "endif()\n";
    os << indentN << "unset(_cmake_export_file_changed)\n";
    os << indent << "endif()\n";
    /* clang-format on */

    // All of these files are siblings; get its location to know where the
    // "anchor" file is.
    files.push_back(toInstallFile);
    this->AddInstallRule(os, cxx_module_dest, cmInstallType_FILES, files,
                         false, this->FilePermissions.c_str(), nullptr,
                         nullptr, nullptr, indent);
    files.clear();
  }
  for (auto const& i : this->EFGen->GetConfigCxxModuleFiles()) {
    files.push_back(i.second);
    std::string config_test = this->CreateConfigTest(i.first);
    os << indent << "if(" << config_test << ")\n";
    this->AddInstallRule(os, cxx_module_dest, cmInstallType_FILES, files,
                         false, this->FilePermissions.c_str(), nullptr,
                         nullptr, nullptr, indent.Next());
    os << indent << "endif()\n";
    files.clear();
  }
  for (auto const& i : this->EFGen->GetConfigCxxModuleTargetFiles()) {
    std::string config_test = this->CreateConfigTest(i.first);
    os << indent << "if(" << config_test << ")\n";
    this->AddInstallRule(os, cxx_module_dest, cmInstallType_FILES, i.second,
                         false, this->FilePermissions.c_str(), nullptr,
                         nullptr, nullptr, indent.Next());
    os << indent << "endif()\n";
    files.clear();
  }
}